

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O2

fsg_link_t * fsg_arciter_get(fsg_arciter_t *itor)

{
  gnode_t *pgVar1;
  
  pgVar1 = itor->gn;
  if (pgVar1 == (gnode_t *)0x0) {
    if (itor->null_itor == (hash_iter_t *)0x0) {
      return (fsg_link_t *)0x0;
    }
    pgVar1 = (gnode_t *)&itor->null_itor->ent->val;
  }
  return (fsg_link_t *)(pgVar1->data).ptr;
}

Assistant:

fsg_link_t *
fsg_arciter_get(fsg_arciter_t * itor)
{
    /* Iterate over non-null arcs first. */
    if (itor->gn)
        return (fsg_link_t *) gnode_ptr(itor->gn);
    else if (itor->null_itor)
        return (fsg_link_t *) hash_entry_val(itor->null_itor->ent);
    else
        return NULL;
}